

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::ClampScrollOffsetRecursive(Element *this)

{
  int iVar1;
  Element *this_00;
  undefined4 local_18;
  int i;
  int num_children;
  Element *this_local;
  
  ClampScrollOffset(this);
  iVar1 = GetNumChildren(this,false);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_00 = GetChild(this,local_18);
    ClampScrollOffsetRecursive(this_00);
  }
  return;
}

Assistant:

void Element::ClampScrollOffsetRecursive()
{
	ClampScrollOffset();
	const int num_children = GetNumChildren();
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->ClampScrollOffsetRecursive();
}